

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::Table(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *o)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  InfoType IVar5;
  ulong uVar6;
  Node *pNVar7;
  ulong uVar8;
  Cloner<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
  local_29;
  
  this->mKeyVals = (Node *)&this->mMask;
  this->mInfo = (uint8_t *)&this->mMask;
  this->mNumElements = 0;
  this->mMask = 0;
  this->mMaxNumElementsAllowed = 0;
  this->mInfoInc = 0x20;
  this->mInfoHashShift = 0;
  sVar2 = o->mNumElements;
  if (sVar2 != 0) {
    sVar3 = o->mMask;
    uVar1 = sVar3 + 1;
    if (uVar1 < 0x28f5c28f5c28f5d) {
      uVar8 = (uVar1 * 0x50) / 100;
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar1 >> 2;
      uVar8 = (SUB168(auVar4 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
    }
    uVar6 = 0xff;
    if (uVar8 < 0xff) {
      uVar6 = uVar8;
    }
    pNVar7 = (Node *)malloc((uVar6 + uVar1) * 0x29 + 8);
    if (pNVar7 == (Node *)0x0) {
      doThrow<std::bad_alloc>();
    }
    this->mKeyVals = pNVar7;
    this->mInfo = (uint8_t *)(pNVar7 + uVar6 + uVar1);
    this->mNumElements = sVar2;
    this->mMask = sVar3;
    this->mMaxNumElementsAllowed = o->mMaxNumElementsAllowed;
    IVar5 = o->mInfoHashShift;
    this->mInfoInc = o->mInfoInc;
    this->mInfoHashShift = IVar5;
    Cloner<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
    ::operator()(&local_29,o,this);
  }
  return;
}

Assistant:

Table(const Table& o)
        : WHash(static_cast<const WHash&>(o))
        , WKeyEqual(static_cast<const WKeyEqual&>(o))
        , DataPool(static_cast<const DataPool&>(o)) {
        ROBIN_HOOD_TRACE(this)
        if (!o.empty()) {
            // not empty: create an exact copy. it is also possible to just iterate through all
            // elements and insert them, but copying is probably faster.

            auto const numElementsWithBuffer = calcNumElementsWithBuffer(o.mMask + 1);
            mKeyVals = static_cast<Node*>(detail::assertNotNull<std::bad_alloc>(
                std::malloc(calcNumBytesTotal(numElementsWithBuffer))));
            // no need for calloc because clonData does memcpy
            mInfo = reinterpret_cast<uint8_t*>(mKeyVals + numElementsWithBuffer);
            mNumElements = o.mNumElements;
            mMask = o.mMask;
            mMaxNumElementsAllowed = o.mMaxNumElementsAllowed;
            mInfoInc = o.mInfoInc;
            mInfoHashShift = o.mInfoHashShift;
            cloneData(o);
        }
    }